

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O3

void EC_POINT_clear_free(EC_POINT *point)

{
  code *pcVar1;
  
  if (point != (EC_POINT *)0x0) {
    pcVar1 = *(code **)(*(long *)point + 0x60);
    if ((pcVar1 != (code *)0x0) ||
       (pcVar1 = *(code **)(*(long *)point + 0x58), pcVar1 != (code *)0x0)) {
      (*pcVar1)(point);
    }
    CRYPTO_clear_free(point,0x28);
    return;
  }
  return;
}

Assistant:

void EC_POINT_clear_free(EC_POINT *point)
{
    if (!point)
        return;

    if (point->meth->point_clear_finish != 0)
        point->meth->point_clear_finish(point);
    else if (point->meth->point_finish != 0)
        point->meth->point_finish(point);
    CRYPTO_clear_free(point, sizeof(*point));
}